

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

DdNode * Llb_Nonlin4ComputeBad(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t **ppNodes;
  Vec_Ptr_t *p;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  int local_6c;
  int i;
  Aig_Obj_t *pObj;
  DdNode *bCube;
  DdNode *bResult;
  DdNode *bTemp;
  DdNode *bBdd1;
  DdNode *bBdd0;
  DdNode *bBdd;
  Vec_Ptr_t *vNodes;
  Vec_Int_t *vOrder_local;
  Aig_Man_t *pAig_local;
  DdManager *dd_local;
  
  Aig_ManCleanData(pAig);
  pDVar4 = Cudd_ReadOne(dd);
  pAVar5 = Aig_ManConst1(pAig);
  (pAVar5->field_5).pData = pDVar4;
  for (local_6c = 0; iVar2 = Vec_PtrSize(pAig->vCis), local_6c < iVar2; local_6c = local_6c + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,local_6c);
    iVar2 = Llb_ObjBddVar(vOrder,pAVar5);
    pDVar4 = Cudd_bddIthVar(dd,iVar2);
    (pAVar5->field_5).pData = pDVar4;
  }
  ppNodes = (Aig_Obj_t **)Vec_PtrArray(pAig->vCos);
  iVar2 = Saig_ManPoNum(pAig);
  p = Aig_ManDfsNodes(pAig,ppNodes,iVar2);
  for (local_6c = 0; iVar2 = Vec_PtrSize(p), local_6c < iVar2; local_6c = local_6c + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p,local_6c);
    iVar2 = Aig_ObjIsNode(pAVar5);
    if (iVar2 != 0) {
      pAVar6 = Aig_ObjFanin0(pAVar5);
      pvVar7 = (pAVar6->field_5).pData;
      iVar2 = Aig_ObjFaninC0(pAVar5);
      pAVar6 = Aig_ObjFanin1(pAVar5);
      pvVar1 = (pAVar6->field_5).pData;
      iVar3 = Aig_ObjFaninC1(pAVar5);
      pDVar4 = Cudd_bddAnd(dd,(DdNode *)((ulong)pvVar7 ^ (long)iVar2),
                           (DdNode *)((ulong)pvVar1 ^ (long)iVar3));
      if (pDVar4 == (DdNode *)0x0) {
        for (local_6c = 0; iVar2 = Vec_PtrSize(p), local_6c < iVar2; local_6c = local_6c + 1) {
          pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p,local_6c);
          iVar2 = Aig_ObjIsNode(pAVar5);
          if ((iVar2 != 0) && ((pAVar5->field_5).pData != (void *)0x0)) {
            Cudd_RecursiveDeref(dd,(DdNode *)(pAVar5->field_5).pData);
          }
        }
        Vec_PtrFree(p);
        return (DdNode *)0x0;
      }
      Cudd_Ref(pDVar4);
      (pAVar5->field_5).pData = pDVar4;
    }
  }
  bCube = Cudd_ReadLogicZero(dd);
  Cudd_Ref(bCube);
  for (local_6c = 0; iVar2 = Saig_ManPoNum(pAig), local_6c < iVar2; local_6c = local_6c + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_6c);
    pAVar6 = Aig_ObjFanin0(pAVar5);
    pvVar7 = (pAVar6->field_5).pData;
    iVar2 = Aig_ObjFaninC0(pAVar5);
    pDVar4 = Cudd_bddOr(dd,bCube,(DdNode *)((ulong)pvVar7 ^ (long)iVar2));
    if (pDVar4 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,bCube);
      bCube = pDVar4;
      break;
    }
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDeref(dd,bCube);
    bCube = pDVar4;
  }
  for (local_6c = 0; iVar2 = Vec_PtrSize(p), local_6c < iVar2; local_6c = local_6c + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p,local_6c);
    iVar2 = Aig_ObjIsNode(pAVar5);
    if ((iVar2 != 0) && ((pAVar5->field_5).pData != (void *)0x0)) {
      Cudd_RecursiveDeref(dd,(DdNode *)(pAVar5->field_5).pData);
    }
  }
  Vec_PtrFree(p);
  if (bCube != (DdNode *)0x0) {
    pObj = (Aig_Obj_t *)Cudd_ReadOne(dd);
    Cudd_Ref((DdNode *)pObj);
    for (local_6c = 0; iVar2 = Saig_ManPiNum(pAig), local_6c < iVar2; local_6c = local_6c + 1) {
      pvVar7 = Vec_PtrEntry(pAig->vCis,local_6c);
      pAVar5 = (Aig_Obj_t *)Cudd_bddAnd(dd,(DdNode *)pObj,*(DdNode **)((long)pvVar7 + 0x28));
      if (pAVar5 == (Aig_Obj_t *)0x0) {
        Cudd_RecursiveDeref(dd,(DdNode *)pObj);
        Cudd_RecursiveDeref(dd,bCube);
        bCube = (DdNode *)0x0;
        pObj = pAVar5;
        break;
      }
      Cudd_Ref((DdNode *)pAVar5);
      Cudd_RecursiveDeref(dd,(DdNode *)pObj);
      pObj = pAVar5;
    }
    if (bCube != (DdNode *)0x0) {
      pDVar4 = Cudd_bddExistAbstract(dd,bCube,(DdNode *)pObj);
      Cudd_Ref(pDVar4);
      Cudd_RecursiveDeref(dd,bCube);
      Cudd_RecursiveDeref(dd,(DdNode *)pObj);
      Cudd_Deref(pDVar4);
      bCube = pDVar4;
    }
  }
  return bCube;
}

Assistant:

DdNode * Llb_Nonlin4ComputeBad( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder )
{
    Vec_Ptr_t * vNodes;
    DdNode * bBdd, * bBdd0, * bBdd1, * bTemp, * bResult, * bCube;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanData( pAig );
    // assign elementary variables
    Aig_ManConst1(pAig)->pData = Cudd_ReadOne(dd); 
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    // compute internal nodes
    vNodes = Aig_ManDfsNodes( pAig, (Aig_Obj_t **)Vec_PtrArray(pAig->vCos), Saig_ManPoNum(pAig) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
        bBdd  = Cudd_bddAnd( dd, bBdd0, bBdd1 );
        if ( bBdd == NULL )
        {
            Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
                if ( Aig_ObjIsNode(pObj) && pObj->pData != NULL )
                    Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
            Vec_PtrFree( vNodes );
            return NULL;
        }
        Cudd_Ref( bBdd );
        pObj->pData = bBdd;
    }
    // quantify PIs of each PO
    bResult = Cudd_ReadLogicZero( dd );  Cudd_Ref( bResult );
    Saig_ManForEachPo( pAig, pObj, i )
    {
        bBdd0   = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bResult = Cudd_bddOr( dd, bTemp = bResult, bBdd0 );     
        if ( bResult == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp );
            break;
        }
        Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    // deref
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsNode(pObj) && pObj->pData != NULL )
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    Vec_PtrFree( vNodes );
    if ( bResult )
    {
        bCube = Cudd_ReadOne(dd);  Cudd_Ref( bCube );
        Saig_ManForEachPi( pAig, pObj, i )
        {
            bCube = Cudd_bddAnd( dd, bTemp = bCube, (DdNode *)pObj->pData );  
            if ( bCube == NULL )
            {
                Cudd_RecursiveDeref( dd, bTemp );
                Cudd_RecursiveDeref( dd, bResult );
                bResult = NULL;
                break;
            }
            Cudd_Ref( bCube );
            Cudd_RecursiveDeref( dd, bTemp );
        }
        if ( bResult != NULL )
        {
            bResult = Cudd_bddExistAbstract( dd, bTemp = bResult, bCube );  Cudd_Ref( bResult );
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bCube );
            Cudd_Deref( bResult );
        }
    }
//if ( bResult )
//printf( "Bad state = %d.\n", Cudd_DagSize(bResult) );
    return bResult;
}